

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall
indigox::utils::
Graph<indigox::NTDVertProp,_indigox::utils::NoProperty,_indigox::utils::DirectedGraph>::RemoveVertex
          (Graph<indigox::NTDVertProp,_indigox::utils::NoProperty,_indigox::utils::DirectedGraph>
           *this,VertType v)

{
  type_conflict tVar1;
  type lhs;
  __shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  iterator_facade<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::bidirectional_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long>
  *in_RDI;
  adj_list_impl<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config,_boost::bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config>_>
  *in_stack_00000008;
  vertex_descriptor in_stack_00000010;
  bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config>
  *in_stack_00000058;
  vertex_descriptor in_stack_00000060;
  __shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffd0;
  iterator_facade<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::bidirectional_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long>
  *this_00;
  
  this_00 = in_RDI;
  std::
  __shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*(in_stack_ffffffffffffffd0);
  boost::
  clear_vertex<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>
            (in_stack_00000060,in_stack_00000058);
  std::
  __shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::bidirectionalS,_indigox::NTDVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*(in_RSI);
  boost::
  remove_vertex<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config,boost::bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>>
            (in_stack_00000010,in_stack_00000008);
  boost::bimaps::container_adaptor::associative_container_adaptor<$25d008e8$>::find<void_*>
            ((associative_container_adaptor<_25d008e8_> *)this_00,(void **)in_RSI);
  lhs.m_iterator.node =
       (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
        )boost::bimaps::container_adaptor::container_adaptor<$d397f74f$>::end
                   ((container_adaptor<_d397f74f_> *)in_RDI);
  tVar1 = boost::iterators::operator!=
                    ((iterator_facade<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::bidirectional_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long>
                      *)lhs.m_iterator.node,in_RDI);
  if (tVar1) {
    boost::bimaps::container_adaptor::associative_container_adaptor<$25d008e8$>::erase<void_*>
              ((associative_container_adaptor<_25d008e8_> *)lhs.m_iterator.node,(void **)in_RDI);
  }
  return;
}

Assistant:

void RemoveVertex(VertType v)
      {
        boost::clear_vertex(v, *graph_);
        boost::remove_vertex(v, *graph_);
        if (vert_idxmap_.left.find(v) != vert_idxmap_.left.end()) {
          vert_idxmap_.left.erase(v);
        }
        
      }